

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

Expression *
slang::ast::RangeSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,ConstantRange range,ASTContext *context)

{
  SourceRange *pSVar1;
  Scope *scope;
  long lVar2;
  SourceRange valueRange;
  DeferredSourceRange sourceRange;
  DeferredSourceRange sourceRange_00;
  bool bVar3;
  ulong uVar4;
  RangeSelectExpression *expr;
  Type *this;
  Type *pTVar5;
  Expression *pEVar6;
  Type *pTVar7;
  uint uVar8;
  Expression *left;
  Expression *right;
  undefined4 in_stack_ffffffffffffff74;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  uint local_78;
  ushort local_74;
  Expression *local_70;
  Expression *local_68;
  SourceLocation local_60;
  SourceLocation SStack_58;
  undefined8 local_50;
  SourceLocation local_48;
  SourceLocation SStack_40;
  undefined8 local_38;
  
  uVar8 = range.left;
  local_80 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)(int)uVar8;
  local_74 = 1;
  uVar4 = (ulong)(int)((int)uVar8 >> 0x1f ^ uVar8);
  if (uVar4 == 0) {
    local_78 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    local_78 = (uint)lVar2 ^ 0x3f;
  }
  local_78 = 0x41 - local_78;
  SVInt::clearUnusedBits((SVInt *)&local_80);
  local_70 = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_80);
  if (((0x40 < local_78) || ((local_74 & 0x100) != 0)) && ((void *)local_80.val != (void *)0x0)) {
    operator_delete__(local_80.pVal);
  }
  Expression::selfDetermined(context,&local_70);
  local_80.val = (long)range >> 0x20;
  local_74 = 1;
  uVar4 = (ulong)(range.right >> 0x1f ^ range.right);
  if (uVar4 == 0) {
    local_78 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    local_78 = (uint)lVar2 ^ 0x3f;
  }
  local_78 = 0x41 - local_78;
  SVInt::clearUnusedBits((SVInt *)&local_80);
  local_68 = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_80);
  if (((0x40 < local_78) || ((local_74 & 0x100) != 0)) && ((void *)local_80.val != (void *)0x0)) {
    operator_delete__(local_80.pVal);
  }
  Expression::selfDetermined(context,&local_68);
  local_80.val = local_80.val & 0xffffffff00000000;
  expr = BumpAllocator::
         emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,(RangeSelectionKind *)&local_80.val,
                    compilation->errorType,value,local_70,local_68,&value->sourceRange);
  bVar3 = Expression::bad(value);
  if (((!bVar3) && (bVar3 = Expression::bad(local_70), !bVar3)) &&
     (bVar3 = Expression::bad(local_68), !bVar3)) {
    pTVar7 = (value->type).ptr;
    valueRange.endLoc._0_4_ = 1;
    valueRange.startLoc = (value->sourceRange).endLoc;
    valueRange.endLoc._4_4_ = in_stack_ffffffffffffff74;
    this = getIndexedType(compilation,context,pTVar7,value->sourceRange,valueRange,
                          SUB81((value->sourceRange).startLoc,0));
    pTVar5 = this->canonical;
    if (pTVar5 == (Type *)0x0) {
      Type::resolveCanonical(this);
      pTVar5 = this->canonical;
    }
    if ((pTVar5->super_Symbol).kind != ErrorType) {
      bVar3 = Type::isUnpackedArray(pTVar7);
      scope = (context->scope).ptr;
      pSVar1 = &(expr->super_Expression).sourceRange;
      local_60 = pSVar1->startLoc;
      SStack_58 = (expr->super_Expression).sourceRange.endLoc;
      if (bVar3) {
        local_38 = 1;
        sourceRange.range.endLoc._4_4_ = SStack_58._4_4_;
        sourceRange.range.startLoc = pSVar1->startLoc;
        sourceRange.range.endLoc._0_4_ = *(undefined4 *)&(pSVar1->endLoc).field_0x0;
        sourceRange.node.value = 1;
        local_48 = local_60;
        SStack_40 = SStack_58;
        pTVar7 = FixedSizeUnpackedArrayType::fromDim(scope,this,range,sourceRange);
      }
      else {
        local_50 = 1;
        sourceRange_00.range.endLoc._4_4_ = SStack_58._4_4_;
        sourceRange_00.range.startLoc = pSVar1->startLoc;
        sourceRange_00.range.endLoc._0_4_ = *(undefined4 *)&(pSVar1->endLoc).field_0x0;
        sourceRange_00.node.value = 1;
        pTVar7 = PackedArrayType::fromDim(scope,this,range,sourceRange_00);
      }
      (expr->super_Expression).type.ptr = pTVar7;
      return &expr->super_Expression;
    }
  }
  pEVar6 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar6;
}

Assistant:

Expression& RangeSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                ConstantRange range, const ASTContext& context) {
    Expression* left = &IntegerLiteral::fromConstant(compilation, range.left);
    selfDetermined(context, left);

    Expression* right = &IntegerLiteral::fromConstant(compilation, range.right);
    selfDetermined(context, right);

    auto result = compilation.emplace<RangeSelectExpression>(RangeSelectionKind::Simple,
                                                             compilation.getErrorType(), value,
                                                             *left, *right, value.sourceRange);
    if (value.bad() || left->bad() || right->bad())
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, value.sourceRange,
                                             value.sourceRange, true);

    if (elementType.isError())
        return badExpr(compilation, result);

    // This method is only called on expressions with a fixed range type.
    SLANG_ASSERT(range.isLittleEndian() == valueType.getFixedRange().isLittleEndian());
    SLANG_ASSERT(valueType.hasFixedRange());

    if (valueType.isUnpackedArray()) {
        result->type = &FixedSizeUnpackedArrayType::fromDim(*context.scope, elementType, range,
                                                            result->sourceRange);
    }
    else {
        result->type = &PackedArrayType::fromDim(*context.scope, elementType, range,
                                                 result->sourceRange);
    }

    return *result;
}